

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool getTypedProperty<bool>
               (cmGeneratorTarget *tgt,string *prop,
               cmGeneratorExpressionInterpreter *genexInterpreter)

{
  cmValue this;
  string *psVar1;
  bool local_75;
  allocator<char> local_62;
  byte local_61;
  string local_60;
  string_view local_40;
  cmValue local_30;
  cmValue value;
  cmGeneratorExpressionInterpreter *genexInterpreter_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  value.Value = (string *)genexInterpreter;
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    tgt_local._7_1_ = cmGeneratorTarget::GetPropertyAsBool(tgt,prop);
  }
  else {
    local_30 = cmGeneratorTarget::GetProperty(tgt,prop);
    this.Value = value.Value;
    local_75 = cmValue::operator_cast_to_bool(&local_30);
    local_61 = 0;
    if (local_75) {
      psVar1 = cmValue::operator*[abi_cxx11_(&local_30);
      std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
      local_61 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
    }
    local_75 = !local_75;
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(this.Value,&local_60,prop);
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar1);
    tgt_local._7_1_ = cmIsOn(local_40);
    if (local_75) {
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_62);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return tgt_local._7_1_;
}

Assistant:

bool getTypedProperty<bool>(cmGeneratorTarget const* tgt,
                            const std::string& prop,
                            cmGeneratorExpressionInterpreter* genexInterpreter)
{
  if (genexInterpreter == nullptr) {
    return tgt->GetPropertyAsBool(prop);
  }

  cmValue value = tgt->GetProperty(prop);
  return cmIsOn(genexInterpreter->Evaluate(value ? *value : "", prop));
}